

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O2

mz_bool mz_zip_writer_add_mem_ex_v2
                  (mz_zip_archive *pZip,char *pArchive_name,void *pBuf,size_t buf_size,
                  void *pComment,mz_uint16 comment_size,mz_uint level_and_flags,
                  mz_uint64 uncomp_size,mz_uint32 uncomp_crc32,time_t *last_modified,
                  char *user_extra_data,mz_uint user_extra_data_len,char *user_extra_data_central,
                  mz_uint user_extra_data_central_len)

{
  mz_zip_internal_state *pArray;
  mz_uint64 *pmVar1;
  char *user_extra_data_00;
  tdefl_compressor *d;
  mz_uint64 mVar2;
  mz_uint mVar3;
  mz_bool mVar4;
  mz_uint32 mVar5;
  tdefl_status tVar6;
  time_t *ptVar7;
  size_t sVar8;
  mz_uint64 *pmVar9;
  size_t sVar10;
  size_t sVar11;
  undefined4 extraout_var;
  sbyte sVar12;
  ushort uVar13;
  mz_uint64 *pmVar14;
  mz_uint64 *pmVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  byte bVar19;
  bool bVar20;
  sbyte sVar21;
  int iVar22;
  int iVar23;
  undefined6 in_register_0000008a;
  undefined1 uVar24;
  mz_uint64 mVar25;
  uint uVar26;
  uint level;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  char *local_130;
  ulong local_128;
  mz_uint64 comp_size;
  mz_uint8 *local_118;
  tdefl_compressor *local_110;
  size_t local_108;
  ulong local_100;
  mz_zip_writer_add_state state;
  mz_uint64 local_dir_header_ofs;
  uint local_c4;
  uint local_c0;
  int local_bc;
  time_t cur_time;
  undefined1 uStack_b0;
  undefined1 uStack_af;
  undefined1 uStack_ae;
  undefined1 uStack_ad;
  undefined1 uStack_ac;
  undefined1 uStack_ab;
  undefined2 uStack_aa;
  undefined6 uStack_a8;
  long lStack_a2;
  size_t local_90;
  ulong local_88;
  mz_uint8 *local_80;
  undefined8 local_78;
  ulong local_70;
  ulong local_68;
  void *local_60;
  mz_uint8 extra_data [28];
  
  local_128 = CONCAT44(local_128._4_4_,(int)CONCAT62(in_register_0000008a,comment_size));
  dos_time = 0;
  dos_date = 0;
  mVar25 = pZip->m_archive_size;
  comp_size = 0;
  uVar26 = 6;
  if (-1 < (int)level_and_flags) {
    uVar26 = level_and_flags;
  }
  if (uncomp_size == 0) {
    uVar13 = (ushort)((uVar26 & 0x400) == 0 && buf_size != 0) << 3;
  }
  else {
    uVar13 = 8;
  }
  if ((uVar26 >> 0x10 & 1) == 0) {
    uVar13 = uVar13 + 0x800;
  }
  level = uVar26 & 0xf;
  pArray = pZip->m_pState;
  if ((pArray == (mz_zip_internal_state *)0x0) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING)) {
LAB_0011b07a:
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  if ((pArchive_name == (char *)0x0) ||
     ((pBuf == (void *)0x0 && buf_size != 0 ||
      (pComment == (void *)0x0 && comment_size != 0 || 10 < level)))) goto LAB_0011b07a;
  if (pArray->m_zip64 == 0) {
    if ((uncomp_size | buf_size) >> 0x20 != 0 || pZip->m_total_files == 0xffff) {
      pArray->m_zip64 = 1;
    }
  }
  else if (pZip->m_total_files == 0xffffffff) {
    pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
    return 0;
  }
  if (uncomp_size != 0 && (uVar26 & 0x400) == 0) goto LAB_0011b07a;
  if (*pArchive_name == '/') {
    pZip->m_last_error = MZ_ZIP_INVALID_FILENAME;
    return 0;
  }
  local_80 = (mz_uint8 *)pBuf;
  local_60 = pComment;
  ptVar7 = last_modified;
  local_130 = pArchive_name;
  local_108 = buf_size;
  local_dir_header_ofs = mVar25;
  if (last_modified == (time_t *)0x0) {
    time(&cur_time);
    ptVar7 = &cur_time;
  }
  mz_zip_time_t_to_dos_time(*ptVar7,&dos_time,&dos_date);
  sVar11 = local_108;
  if ((uVar26 & 0x400) == 0) {
    local_88 = mz_crc32(0,local_80,local_108);
    uncomp_size = sVar11;
    if (sVar11 < 4) {
      level = 0;
    }
    bVar20 = sVar11 < 4 || ((uVar26 & 0xf) == 0 || (uVar26 & 0x400) != 0);
  }
  else {
    local_88 = (ulong)uncomp_crc32;
    bVar20 = true;
  }
  sVar8 = strlen(local_130);
  if (0xffff < sVar8) {
    pZip->m_last_error = MZ_ZIP_INVALID_FILENAME;
    return 0;
  }
  mVar3 = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);
  sVar11 = (pArray->m_central_dir).m_size;
  local_70 = local_128 & 0xffff;
  if (0xfffffffe < sVar11 + local_70 + sVar8 + 0x4a) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
    return 0;
  }
  lVar16 = 0x1c;
  local_100 = CONCAT44(local_100._4_4_,mVar3);
  uVar18 = (ulong)mVar3;
  local_68 = (ulong)user_extra_data_len;
  if (pArray->m_zip64 == 0) {
    if ((pZip->m_archive_size +
        (ulong)user_extra_data_central_len + local_70 + local_68 + sVar8 * 2 + uVar18 + sVar11) -
        0xffffff8e < 0xffffffff00000000) {
      pArray->m_zip64 = 1;
    }
    else {
      lVar16 = 0;
    }
  }
  local_78 = 0;
  if ((sVar8 != 0) && (local_130[sVar8 - 1] == '/')) {
    if (uncomp_size != 0 || local_108 != 0) goto LAB_0011b07a;
    local_78 = 0x10;
  }
  uVar17 = lVar16 + local_70 + sVar8 + sVar11 + 0x2e;
  local_128 = sVar8;
  if ((((pArray->m_central_dir).m_capacity < uVar17) &&
      (mVar4 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar17,1), mVar4 == 0)) ||
     ((uVar17 = (pArray->m_central_dir_offsets).m_size + 1,
      (pArray->m_central_dir_offsets).m_capacity < uVar17 &&
      (mVar4 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir_offsets,uVar17,1),
      mVar4 == 0)))) {
LAB_0011b414:
    pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
    return 0;
  }
  if (local_108 == 0 || bVar20 != false) {
    local_110 = (tdefl_compressor *)0x0;
  }
  else {
    local_110 = (tdefl_compressor *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x4df78);
    if (local_110 == (tdefl_compressor *)0x0) goto LAB_0011b414;
  }
  mVar4 = mz_zip_writer_write_zeros(pZip,mVar25,(mz_uint32)local_100);
  uVar17 = local_128;
  if (mVar4 == 0) {
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_110);
    return 0;
  }
  local_dir_header_ofs = local_dir_header_ofs + uVar18;
  if ((pZip->m_file_offset_alignment != 0) &&
     ((pZip->m_file_offset_alignment - 1 & local_dir_header_ofs) != 0)) {
    __assert_fail("(local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyexr/deps/miniz/miniz.c"
                  ,0x18d6,
                  "mz_bool mz_zip_writer_add_mem_ex_v2(mz_zip_archive *, const char *, const void *, size_t, const void *, mz_uint16, mz_uint, mz_uint64, mz_uint32, time_t *, const char *, mz_uint, const char *, mz_uint)"
                 );
  }
  uVar18 = mVar25 + uVar18;
  uStack_a8 = 0;
  lStack_a2 = 0;
  cur_time = 0;
  uStack_b0 = 0;
  uStack_af = 0;
  uStack_ae = 0;
  uStack_ad = 0;
  uStack_ac = 0;
  uStack_ab = 0;
  uStack_aa = 0;
  bVar19 = bVar20 ^ 1U | (uVar26 & 0x400) != 0;
  iVar23 = (uint)bVar19 << 3;
  local_100 = (ulong)uVar13;
  local_bc = iVar23;
  if (pArray->m_zip64 == 0) {
    if (uVar18 >> 0x20 != 0 || comp_size._4_4_ != 0) {
      pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
      return 0;
    }
    uVar24 = 0x14;
    if (bVar19 == 0) {
      uVar24 = 0;
    }
    cur_time._0_5_ = CONCAT14(uVar24,0x4034b50);
    cur_time._0_6_ = (uint6)(uint5)cur_time;
    cur_time._0_7_ = CONCAT16((char)uVar13,(uint6)cur_time);
    cur_time = CONCAT17((char)(uVar13 >> 8),(undefined7)cur_time);
    uStack_ae = (undefined1)dos_time;
    local_c0 = (uint)dos_time;
    uStack_ad = (undefined1)(dos_time >> 8);
    local_c4 = (uint)dos_date;
    uStack_ac = (undefined1)dos_date;
    uStack_ab = (undefined1)(dos_date >> 8);
    uStack_aa = 0;
    uStack_a8 = 0;
    lStack_a2 = (ulong)CONCAT13((char)(user_extra_data_len >> 8),
                                CONCAT12((char)user_extra_data_len,(short)local_128)) << 0x20;
    uStack_b0 = (char)iVar23;
    sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_dir_header_ofs,&cur_time,0x1e);
    if (sVar11 != 0x1e) {
LAB_0011b877:
      pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
      return 0;
    }
    sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar18 + 0x1e,local_130,uVar17);
    if (sVar11 != uVar17) {
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_110);
      goto LAB_0011b877;
    }
    mVar25 = uVar18 + 0x1e + uVar17;
    local_118 = (mz_uint8 *)0x0;
    local_90 = 0;
LAB_0011b676:
    uVar18 = local_68;
    if (user_extra_data_len != 0) {
      sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar25,user_extra_data,local_68);
      if (sVar11 != uVar18) {
LAB_0011b6ea:
        pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
        return 0;
      }
      mVar25 = mVar25 + uVar18;
    }
    sVar11 = local_108;
    if (bVar20 == false) {
      mVar2 = comp_size;
      if (local_108 != 0) {
        state.m_comp_size = 0;
        state.m_pZip = pZip;
        state.m_cur_archive_file_ofs = mVar25;
        mVar3 = tdefl_create_comp_flags_from_zip_params(level,-0xf,0);
        d = local_110;
        tdefl_init(local_110,mz_zip_writer_add_put_buf_callback,&state,mVar3);
        tVar6 = tdefl_compress_buffer(d,local_80,local_108,TDEFL_FINISH);
        mVar25 = state.m_cur_archive_file_ofs;
        mVar2 = state.m_comp_size;
        if (tVar6 != TDEFL_STATUS_DONE) {
          (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_110);
          pZip->m_last_error = MZ_ZIP_COMPRESSION_FAILED;
          return 0;
        }
      }
LAB_0011b774:
      comp_size = mVar2;
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_110);
      if (uncomp_size == 0) {
        uVar18 = 0;
      }
      else {
        if ((local_100 & 8) == 0) {
          __assert_fail("bit_flags & MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR",
                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyexr/deps/miniz/miniz.c"
                        ,0x1943,
                        "mz_bool mz_zip_writer_add_mem_ex_v2(mz_zip_archive *, const char *, const void *, size_t, const void *, mz_uint16, mz_uint, mz_uint64, mz_uint32, time_t *, const char *, mz_uint, const char *, mz_uint)"
                       );
        }
        state.m_pZip = (mz_zip_archive *)
                       CONCAT17((char)(local_88 >> 0x18),
                                CONCAT16((char)(local_88 >> 0x10),
                                         CONCAT15((char)(local_88 >> 8),
                                                  CONCAT14((char)local_88,0x8074b50))));
        uVar24 = (undefined1)uncomp_size;
        if (local_118 == (mz_uint8 *)0x0) {
          if (comp_size >> 0x20 != 0) {
            pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
            return 0;
          }
          pmVar9 = &state.m_cur_archive_file_ofs;
          pmVar14 = &state.m_cur_archive_file_ofs;
          pmVar15 = &state.m_cur_archive_file_ofs;
          state.m_cur_archive_file_ofs = CONCAT44(state.m_cur_archive_file_ofs._4_4_,(int)comp_size)
          ;
          sVar21 = 0x18;
          sVar11 = 0x10;
          sVar12 = 8;
          pmVar1 = &state.m_cur_archive_file_ofs;
          sVar10 = sVar11;
        }
        else {
          pmVar9 = &state.m_comp_size;
          pmVar14 = &state.m_comp_size;
          pmVar15 = &state.m_comp_size;
          state.m_cur_archive_file_ofs = comp_size;
          state.m_comp_size._0_4_ = (undefined4)uncomp_size;
          pmVar1 = &state.m_comp_size;
          uVar24 = (undefined1)(uncomp_size >> 0x20);
          sVar21 = 0x38;
          sVar11 = 0x30;
          sVar12 = 0x28;
          sVar10 = 0x18;
        }
        *(undefined1 *)((long)pmVar1 + 4) = uVar24;
        *(char *)((long)pmVar15 + 5) = (char)(uncomp_size >> sVar12);
        *(char *)((long)pmVar14 + 6) = (char)(uncomp_size >> (sbyte)sVar11);
        *(char *)((long)pmVar9 + 7) = (char)(uncomp_size >> sVar21);
        sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar25,&state,sVar10);
        if (sVar11 != sVar10) {
          return 0;
        }
        mVar25 = mVar25 + sVar10;
        uVar18 = uncomp_size;
      }
      user_extra_data_00 = user_extra_data_central;
      if (local_118 != (mz_uint8 *)0x0) {
        pmVar9 = (mz_uint64 *)0x0;
        if (0xfffffffe < uVar18) {
          pmVar9 = &uncomp_size;
        }
        pmVar14 = &comp_size;
        if (uVar18 < 0xffffffff) {
          pmVar14 = (mz_uint64 *)0x0;
        }
        pmVar15 = (mz_uint64 *)0x0;
        if (0xfffffffe < local_dir_header_ofs) {
          pmVar15 = &local_dir_header_ofs;
        }
        mVar5 = mz_zip_writer_create_zip64_extra_data(extra_data,pmVar9,pmVar14,pmVar15);
        local_90 = CONCAT44(extraout_var,mVar5);
        uVar18 = uncomp_size;
      }
      mVar4 = mz_zip_writer_add_to_central_dir
                        (pZip,local_130,(mz_uint16)local_128,local_118,(mz_uint16)local_90,local_60,
                         (mz_uint16)local_70,uVar18,comp_size,(mz_uint32)local_88,
                         (mz_uint16)local_bc,(mz_uint16)local_100,(mz_uint16)local_c0,
                         (mz_uint16)local_c4,local_dir_header_ofs,(mz_uint32)local_78,
                         user_extra_data_00,user_extra_data_central_len);
      if (mVar4 == 0) {
        return 0;
      }
      pZip->m_total_files = pZip->m_total_files + 1;
      pZip->m_archive_size = mVar25;
      return 1;
    }
    sVar10 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar25,local_80,local_108);
    if (sVar10 == sVar11) {
      mVar25 = mVar25 + local_108;
      mVar2 = local_108;
      goto LAB_0011b774;
    }
  }
  else {
    if (local_dir_header_ofs < 0xffffffff && uncomp_size < 0xffffffff) {
      local_118 = (mz_uint8 *)0x0;
      sVar11 = 0;
    }
    else {
      pmVar14 = (mz_uint64 *)0x0;
      pmVar9 = &uncomp_size;
      if (uncomp_size < 0xffffffff) {
        pmVar9 = pmVar14;
      }
      pmVar15 = &comp_size;
      if (uncomp_size < 0xffffffff) {
        pmVar15 = pmVar14;
      }
      if (0xfffffffe < local_dir_header_ofs) {
        pmVar14 = &local_dir_header_ofs;
      }
      local_118 = extra_data;
      mVar5 = mz_zip_writer_create_zip64_extra_data(local_118,pmVar9,pmVar15,pmVar14);
      sVar11 = (size_t)mVar5;
    }
    uVar17 = local_128;
    iVar22 = user_extra_data_len + (int)sVar11;
    uVar24 = 0x14;
    if (bVar19 == 0) {
      uVar24 = 0;
    }
    cur_time._0_5_ = CONCAT14(uVar24,0x4034b50);
    cur_time._0_6_ = (uint6)(uint5)cur_time;
    cur_time._0_7_ = CONCAT16((char)local_100,(uint6)cur_time);
    cur_time = CONCAT17((char)(local_100 >> 8),(undefined7)cur_time);
    uStack_af = 0;
    uStack_ae = (undefined1)dos_time;
    local_c0 = (uint)dos_time;
    uStack_ad = (undefined1)(dos_time >> 8);
    local_c4 = (uint)dos_date;
    uStack_ac = (undefined1)dos_date;
    uStack_ab = (undefined1)(dos_date >> 8);
    uStack_aa = 0;
    uStack_a8 = 0;
    lStack_a2 = (ulong)CONCAT13((char)((uint)iVar22 >> 8),CONCAT12((char)iVar22,(short)local_128))
                << 0x20;
    uStack_b0 = (char)iVar23;
    sVar10 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_dir_header_ofs,&cur_time,0x1e);
    if (sVar10 != 0x1e) goto LAB_0011b894;
    sVar10 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar18 + 0x1e,local_130,uVar17);
    if (sVar10 == uVar17) {
      mVar25 = uVar18 + 0x1e + uVar17;
      local_90 = sVar11;
      if (local_118 == (mz_uint8 *)0x0) {
        local_118 = (mz_uint8 *)0x0;
      }
      else {
        sVar10 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar25,extra_data,sVar11);
        if (sVar10 != sVar11) goto LAB_0011b6ea;
        mVar25 = mVar25 + sVar11;
      }
      goto LAB_0011b676;
    }
  }
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_110);
LAB_0011b894:
  pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
  return 0;
}

Assistant:

mz_bool mz_zip_writer_add_mem_ex_v2(mz_zip_archive *pZip, const char *pArchive_name, const void *pBuf, size_t buf_size, const void *pComment, mz_uint16 comment_size,
                                    mz_uint level_and_flags, mz_uint64 uncomp_size, mz_uint32 uncomp_crc32, MZ_TIME_T *last_modified,
                                    const char *user_extra_data, mz_uint user_extra_data_len, const char *user_extra_data_central, mz_uint user_extra_data_central_len)
{
    mz_uint16 method = 0, dos_time = 0, dos_date = 0;
    mz_uint level, ext_attributes = 0, num_alignment_padding_bytes;
    mz_uint64 local_dir_header_ofs = pZip->m_archive_size, cur_archive_file_ofs = pZip->m_archive_size, comp_size = 0;
    size_t archive_name_size;
    mz_uint8 local_dir_header[MZ_ZIP_LOCAL_DIR_HEADER_SIZE];
    tdefl_compressor *pComp = NULL;
    mz_bool store_data_uncompressed;
    mz_zip_internal_state *pState;
    mz_uint8 *pExtra_data = NULL;
    mz_uint32 extra_size = 0;
    mz_uint8 extra_data[MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE];
    mz_uint16 bit_flags = 0;

    if ((int)level_and_flags < 0)
        level_and_flags = MZ_DEFAULT_LEVEL;

    if (uncomp_size || (buf_size && !(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)))
        bit_flags |= MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR;

    if (!(level_and_flags & MZ_ZIP_FLAG_ASCII_FILENAME))
        bit_flags |= MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_UTF8;

    level = level_and_flags & 0xF;
    store_data_uncompressed = ((!level) || (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA));

    if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || ((buf_size) && (!pBuf)) || (!pArchive_name) || ((comment_size) && (!pComment)) || (level > MZ_UBER_COMPRESSION))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    if (pState->m_zip64)
    {
        if (pZip->m_total_files == MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }
    else
    {
        if (pZip->m_total_files == MZ_UINT16_MAX)
        {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES); */
        }
        if (((mz_uint64)buf_size > 0xFFFFFFFF) || (uncomp_size > 0xFFFFFFFF))
        {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
        }
    }

    if ((!(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) && (uncomp_size))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (!mz_zip_writer_validate_archive_name(pArchive_name))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

#ifndef MINIZ_NO_TIME
    if (last_modified != NULL)
    {
        mz_zip_time_t_to_dos_time(*last_modified, &dos_time, &dos_date);
    }
    else
    {
        MZ_TIME_T cur_time;
        time(&cur_time);
        mz_zip_time_t_to_dos_time(cur_time, &dos_time, &dos_date);
    }
#endif /* #ifndef MINIZ_NO_TIME */

	if (!(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA))
	{
		uncomp_crc32 = (mz_uint32)mz_crc32(MZ_CRC32_INIT, (const mz_uint8 *)pBuf, buf_size);
		uncomp_size = buf_size;
		if (uncomp_size <= 3)
		{
			level = 0;
			store_data_uncompressed = MZ_TRUE;
		}
	}

    archive_name_size = strlen(pArchive_name);
    if (archive_name_size > MZ_UINT16_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

    num_alignment_padding_bytes = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

    /* miniz doesn't support central dirs >= MZ_UINT32_MAX bytes yet */
    if (((mz_uint64)pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE + comment_size) >= MZ_UINT32_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

    if (!pState->m_zip64)
    {
        /* Bail early if the archive would obviously become too large */
        if ((pZip->m_archive_size + num_alignment_padding_bytes + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + archive_name_size
			+ MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + comment_size + user_extra_data_len +
			pState->m_central_dir.m_size + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE + user_extra_data_central_len
			+ MZ_ZIP_DATA_DESCRIPTER_SIZE32) > 0xFFFFFFFF)
        {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
        }
    }

    if ((archive_name_size) && (pArchive_name[archive_name_size - 1] == '/'))
    {
        /* Set DOS Subdirectory attribute bit. */
        ext_attributes |= MZ_ZIP_DOS_DIR_ATTRIBUTE_BITFLAG;

        /* Subdirectories cannot contain data. */
        if ((buf_size) || (uncomp_size))
            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);
    }

    /* Try to do any allocations before writing to the archive, so if an allocation fails the file remains unmodified. (A good idea if we're doing an in-place modification.) */
    if ((!mz_zip_array_ensure_room(pZip, &pState->m_central_dir, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + comment_size + (pState->m_zip64 ? MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE : 0))) || (!mz_zip_array_ensure_room(pZip, &pState->m_central_dir_offsets, 1)))
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

    if ((!store_data_uncompressed) && (buf_size))
    {
        if (NULL == (pComp = (tdefl_compressor *)pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, sizeof(tdefl_compressor))))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    }

    if (!mz_zip_writer_write_zeros(pZip, cur_archive_file_ofs, num_alignment_padding_bytes))
    {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
        return MZ_FALSE;
    }

    local_dir_header_ofs += num_alignment_padding_bytes;
    if (pZip->m_file_offset_alignment)
    {
        MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0);
    }
    cur_archive_file_ofs += num_alignment_padding_bytes;

    MZ_CLEAR_ARR(local_dir_header);

    if (!store_data_uncompressed || (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA))
    {
        method = MZ_DEFLATED;
    }

    if (pState->m_zip64)
    {
        if (uncomp_size >= MZ_UINT32_MAX || local_dir_header_ofs >= MZ_UINT32_MAX)
        {
            pExtra_data = extra_data;
            extra_size = mz_zip_writer_create_zip64_extra_data(extra_data, (uncomp_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
                                                               (uncomp_size >= MZ_UINT32_MAX) ? &comp_size : NULL, (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs : NULL);
        }

        if (!mz_zip_writer_create_local_dir_header(pZip, local_dir_header, (mz_uint16)archive_name_size, (mz_uint16)(extra_size + user_extra_data_len), 0, 0, 0, method, bit_flags, dos_time, dos_date))
            return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, local_dir_header_ofs, local_dir_header, sizeof(local_dir_header)) != sizeof(local_dir_header))
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += sizeof(local_dir_header);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name, archive_name_size) != archive_name_size)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }
        cur_archive_file_ofs += archive_name_size;

        if (pExtra_data != NULL)
        {
            if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, extra_data, extra_size) != extra_size)
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

            cur_archive_file_ofs += extra_size;
        }
    }
    else
    {
        if ((comp_size > MZ_UINT32_MAX) || (cur_archive_file_ofs > MZ_UINT32_MAX))
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);
        if (!mz_zip_writer_create_local_dir_header(pZip, local_dir_header, (mz_uint16)archive_name_size, (mz_uint16)user_extra_data_len, 0, 0, 0, method, bit_flags, dos_time, dos_date))
            return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, local_dir_header_ofs, local_dir_header, sizeof(local_dir_header)) != sizeof(local_dir_header))
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += sizeof(local_dir_header);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name, archive_name_size) != archive_name_size)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }
        cur_archive_file_ofs += archive_name_size;
    }

	if (user_extra_data_len > 0)
	{
		if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, user_extra_data, user_extra_data_len) != user_extra_data_len)
			return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

		cur_archive_file_ofs += user_extra_data_len;
	}

    if (store_data_uncompressed)
    {
        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pBuf, buf_size) != buf_size)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }

        cur_archive_file_ofs += buf_size;
        comp_size = buf_size;
    }
    else if (buf_size)
    {
        mz_zip_writer_add_state state;

        state.m_pZip = pZip;
        state.m_cur_archive_file_ofs = cur_archive_file_ofs;
        state.m_comp_size = 0;

        if ((tdefl_init(pComp, mz_zip_writer_add_put_buf_callback, &state, tdefl_create_comp_flags_from_zip_params(level, -15, MZ_DEFAULT_STRATEGY)) != TDEFL_STATUS_OKAY) ||
            (tdefl_compress_buffer(pComp, pBuf, buf_size, TDEFL_FINISH) != TDEFL_STATUS_DONE))
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_COMPRESSION_FAILED);
        }

        comp_size = state.m_comp_size;
        cur_archive_file_ofs = state.m_cur_archive_file_ofs;
    }

    pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
    pComp = NULL;

    if (uncomp_size)
    {
        mz_uint8 local_dir_footer[MZ_ZIP_DATA_DESCRIPTER_SIZE64];
        mz_uint32 local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE32;

        MZ_ASSERT(bit_flags & MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR);

        MZ_WRITE_LE32(local_dir_footer + 0, MZ_ZIP_DATA_DESCRIPTOR_ID);
        MZ_WRITE_LE32(local_dir_footer + 4, uncomp_crc32);
        if (pExtra_data == NULL)
        {
            if (comp_size > MZ_UINT32_MAX)
                return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

            MZ_WRITE_LE32(local_dir_footer + 8, comp_size);
            MZ_WRITE_LE32(local_dir_footer + 12, uncomp_size);
        }
        else
        {
            MZ_WRITE_LE64(local_dir_footer + 8, comp_size);
            MZ_WRITE_LE64(local_dir_footer + 16, uncomp_size);
            local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE64;
        }

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, local_dir_footer, local_dir_footer_size) != local_dir_footer_size)
            return MZ_FALSE;

        cur_archive_file_ofs += local_dir_footer_size;
    }

    if (pExtra_data != NULL)
    {
        extra_size = mz_zip_writer_create_zip64_extra_data(extra_data, (uncomp_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
                                                           (uncomp_size >= MZ_UINT32_MAX) ? &comp_size : NULL, (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs : NULL);
    }

    if (!mz_zip_writer_add_to_central_dir(pZip, pArchive_name, (mz_uint16)archive_name_size, pExtra_data, (mz_uint16)extra_size, pComment,
                                          comment_size, uncomp_size, comp_size, uncomp_crc32, method, bit_flags, dos_time, dos_date, local_dir_header_ofs, ext_attributes,
                                          user_extra_data_central, user_extra_data_central_len))
        return MZ_FALSE;

    pZip->m_total_files++;
    pZip->m_archive_size = cur_archive_file_ofs;

    return MZ_TRUE;
}